

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_upstream.c
# Opt level: O0

char * ngx_http_upstream_init_main_conf(ngx_conf_t *cf,void *conf)

{
  long lVar1;
  long lVar2;
  ngx_int_t nVar3;
  ngx_pool_t *pnVar4;
  code *local_b8;
  ngx_http_upstream_srv_conf_t **uscfp;
  ngx_http_upstream_header_t *header;
  ngx_http_upstream_init_pt init;
  ngx_hash_init_t hash;
  ngx_hash_key_t *hk;
  ngx_array_t headers_in;
  ngx_uint_t i;
  ngx_http_upstream_main_conf_t *umcf;
  void *conf_local;
  ngx_conf_t *cf_local;
  
  lVar1 = *(long *)((long)conf + 0x10);
  headers_in.pool = (ngx_pool_t *)0x0;
  while( true ) {
    if (*(ngx_pool_t **)((long)conf + 0x18) <= headers_in.pool) {
      nVar3 = ngx_array_init((ngx_array_t *)&hk,cf->temp_pool,0x20,0x20);
      if (nVar3 == 0) {
        for (uscfp = (ngx_http_upstream_srv_conf_t **)ngx_http_upstream_headers_in;
            *uscfp != (ngx_http_upstream_srv_conf_t *)0x0; uscfp = uscfp + 7) {
          hash.temp_pool = (ngx_pool_t *)ngx_array_push((ngx_array_t *)&hk);
          if (hash.temp_pool == (ngx_pool_t *)0x0) {
            return (char *)0xffffffffffffffff;
          }
          ((hash.temp_pool)->d).last = (u_char *)*uscfp;
          ((hash.temp_pool)->d).end = (u_char *)uscfp[1];
          pnVar4 = (ngx_pool_t *)ngx_hash_key_lc((u_char *)uscfp[1],(size_t)*uscfp);
          ((hash.temp_pool)->d).next = pnVar4;
          ((hash.temp_pool)->d).failed = (ngx_uint_t)uscfp;
        }
        hash.hash = (ngx_hash_t *)ngx_hash_key_lc;
        hash.key = (ngx_hash_key_pt)0x200;
        hash.max_size = ngx_cacheline_size + 0x3f & (ngx_cacheline_size - 1 ^ 0xffffffffffffffff);
        hash.bucket_size = (ngx_uint_t)anon_var_dwarf_68f66;
        hash.name = (char *)cf->pool;
        hash.pool = (ngx_pool_t *)0x0;
        init = (ngx_http_upstream_init_pt)conf;
        nVar3 = ngx_hash_init((ngx_hash_init_t *)&init,hk,(ngx_uint_t)headers_in.elts);
        if (nVar3 == 0) {
          cf_local = (ngx_conf_t *)0x0;
        }
        else {
          cf_local = (ngx_conf_t *)0xffffffffffffffff;
        }
      }
      else {
        cf_local = (ngx_conf_t *)0xffffffffffffffff;
      }
      return (char *)cf_local;
    }
    if (**(long **)(lVar1 + (long)headers_in.pool * 8) == 0) {
      local_b8 = ngx_http_upstream_init_round_robin;
    }
    else {
      local_b8 = (code *)**(undefined8 **)(lVar1 + (long)headers_in.pool * 8);
    }
    lVar2 = (*local_b8)(cf,*(undefined8 *)(lVar1 + (long)headers_in.pool * 8));
    if (lVar2 != 0) break;
    headers_in.pool = (ngx_pool_t *)((long)&((headers_in.pool)->d).last + 1);
  }
  return (char *)0xffffffffffffffff;
}

Assistant:

static char *
ngx_http_upstream_init_main_conf(ngx_conf_t *cf, void *conf)
{
    ngx_http_upstream_main_conf_t  *umcf = conf;

    ngx_uint_t                      i;
    ngx_array_t                     headers_in;
    ngx_hash_key_t                 *hk;
    ngx_hash_init_t                 hash;
    ngx_http_upstream_init_pt       init;
    ngx_http_upstream_header_t     *header;
    ngx_http_upstream_srv_conf_t  **uscfp;

    uscfp = umcf->upstreams.elts;

    for (i = 0; i < umcf->upstreams.nelts; i++) {

        init = uscfp[i]->peer.init_upstream ? uscfp[i]->peer.init_upstream:
                                            ngx_http_upstream_init_round_robin;

        if (init(cf, uscfp[i]) != NGX_OK) {
            return NGX_CONF_ERROR;
        }
    }


    /* upstream_headers_in_hash */

    if (ngx_array_init(&headers_in, cf->temp_pool, 32, sizeof(ngx_hash_key_t))
        != NGX_OK)
    {
        return NGX_CONF_ERROR;
    }

    for (header = ngx_http_upstream_headers_in; header->name.len; header++) {
        hk = ngx_array_push(&headers_in);
        if (hk == NULL) {
            return NGX_CONF_ERROR;
        }

        hk->key = header->name;
        hk->key_hash = ngx_hash_key_lc(header->name.data, header->name.len);
        hk->value = header;
    }

    hash.hash = &umcf->headers_in_hash;
    hash.key = ngx_hash_key_lc;
    hash.max_size = 512;
    hash.bucket_size = ngx_align(64, ngx_cacheline_size);
    hash.name = "upstream_headers_in_hash";
    hash.pool = cf->pool;
    hash.temp_pool = NULL;

    if (ngx_hash_init(&hash, headers_in.elts, headers_in.nelts) != NGX_OK) {
        return NGX_CONF_ERROR;
    }

    return NGX_CONF_OK;
}